

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.c
# Opt level: O2

void sysbvm_backtrace_print(void)

{
  uint uVar1;
  void *__ptr;
  ulong uVar2;
  void *backtraceAddresses [100];
  
  uVar1 = backtrace(backtraceAddresses,100);
  if ((int)uVar1 < 0) {
    fwrite("Failed to obtain a backtrace.",0x1d,1,_stderr);
  }
  else {
    __ptr = (void *)backtrace_symbols(backtraceAddresses,uVar1);
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      puts(*(char **)((long)__ptr + uVar2 * 8));
    }
    free(__ptr);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_backtrace_print(void)
{    
    void *backtraceAddresses[SYSBVM_BACKTRACE_PRINT_MAX_SIZE];

    int backtraceSize = sysbvm_backtrace_obtain(backtraceAddresses, SYSBVM_BACKTRACE_PRINT_MAX_SIZE);
    if(backtraceSize < 0)
    {
        fprintf(stderr, "Failed to obtain a backtrace.");
        return;
    }

    char **symbols = sysbvm_backtrace_symbols(backtraceAddresses, backtraceSize);
    for(int i = 0; i < backtraceSize; ++i)
        printf("%s\n", symbols[i]);
    free(symbols);
}